

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::PatternCaseItemSyntax::getChildPtr(PatternCaseItemSyntax *this,size_t index)

{
  undefined8 in_RSI;
  PtrTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    not_null<slang::syntax::PatternSyntax_*>::get
              ((not_null<slang::syntax::PatternSyntax_*> *)
               ((long)&in_RDI[1].super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
               + 8));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 4:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)
               ((long)&in_RDI[4].super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
               + 8));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax PatternCaseItemSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return pattern.get();
        case 1: return &tripleAnd;
        case 2: return expr;
        case 3: return &colon;
        case 4: return statement.get();
        default: return nullptr;
    }
}